

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_CDict *pZVar1;
  undefined1 local_50 [8];
  ZSTD_compressionParameters cParams;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->streamStage == zcss_init) {
    if (cctx->staticSize == 0) {
      cParams.strategy = dictContentType;
      ZSTD_freeCDict(cctx->cdictLocal);
      if ((dict == (void *)0x0) || (dictSize == 0)) {
        cctx->cdictLocal = (ZSTD_CDict *)0x0;
        cctx->cdict = (ZSTD_CDict *)0x0;
      }
      else {
        ZSTD_getCParamsFromCCtxParams
                  ((ZSTD_compressionParameters *)local_50,&cctx->requestedParams,
                   cctx->pledgedSrcSizePlusOne - 1,dictSize);
        cParams_00.hashLog = cParams.windowLog;
        cParams_00.searchLog = cParams.chainLog;
        cParams_00.windowLog = local_50._0_4_;
        cParams_00.chainLog = local_50._4_4_;
        cParams_00.minMatch = cParams.hashLog;
        cParams_00.targetLength = cParams.searchLog;
        cParams_00.strategy = cParams.minMatch;
        pZVar1 = ZSTD_createCDict_advanced
                           (dict,dictSize,dictLoadMethod,cParams.strategy,cParams_00,cctx->customMem
                           );
        cctx->cdictLocal = pZVar1;
        cctx->cdict = cctx->cdictLocal;
        if (cctx->cdictLocal == (ZSTD_CDict *)0x0) {
          return 0xffffffffffffffc0;
        }
      }
      cctx_local = (ZSTD_CCtx *)0x0;
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffc0;
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx, const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod, ZSTD_dictContentType_e dictContentType)
{
    if (cctx->streamStage != zcss_init) return ERROR(stage_wrong);
    if (cctx->staticSize) return ERROR(memory_allocation);  /* no malloc for static CCtx */
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    ZSTD_freeCDict(cctx->cdictLocal);  /* in case one already exists */
    if (dict==NULL || dictSize==0) {   /* no dictionary mode */
        cctx->cdictLocal = NULL;
        cctx->cdict = NULL;
    } else {
        ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(&cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, dictSize);
        cctx->cdictLocal = ZSTD_createCDict_advanced(
                                dict, dictSize,
                                dictLoadMethod, dictContentType,
                                cParams, cctx->customMem);
        cctx->cdict = cctx->cdictLocal;
        if (cctx->cdictLocal == NULL)
            return ERROR(memory_allocation);
    }
    return 0;
}